

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O1

void __thiscall
TPZEqnArray<std::complex<double>_>::EqnBackward
          (TPZEqnArray<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *U,
          DecomposeType dec)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  complex<double> *pcVar4;
  bool bVar5;
  double dVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  complex<double> *pcVar12;
  undefined8 uVar13;
  double dVar14;
  undefined8 uVar15;
  double dVar16;
  double local_48;
  double dStack_40;
  
  if (this->fSymmetric == EIsNonSymmetric) {
    if (1 < (long)this->fNumEq) {
      lVar7 = (long)this->fNumEq;
      do {
        piVar3 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
        iVar1 = piVar3[lVar7 + -2];
        lVar8 = (long)iVar1;
        iVar2 = piVar3[lVar7 + -1];
        dVar14 = 0.0;
        dVar16 = 0.0;
        if (iVar1 + 1 < iVar2) {
          lVar10 = lVar8;
          lVar11 = lVar8 << 4;
          do {
            lVar9 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                          [lVar10 + 1];
            if (((lVar9 < 0) ||
                ((U->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar9)) ||
               ((U->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<std::complex<double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            local_48 = *(double *)U->fElem[lVar9]._M_value;
            dStack_40 = *(double *)(U->fElem[lVar9]._M_value + 8);
            std::complex<double>::operator*=
                      ((complex<double> *)&local_48,
                       (complex<double> *)
                       ((this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                        super_TPZVec<std::complex<double>_>.fStore[1]._M_value + lVar11));
            dVar14 = dVar14 - local_48;
            dVar16 = dVar16 - dStack_40;
            lVar10 = lVar10 + 1;
            lVar11 = lVar11 + 0x10;
          } while (iVar2 + -1 != (int)lVar10);
        }
        lVar10 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar8];
        if (((lVar10 < 0) ||
            ((U->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar10)) ||
           ((U->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<std::complex<double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pcVar12 = U->fElem + lVar10;
        dVar6 = *(double *)(pcVar12->_M_value + 8);
        pcVar4 = U->fElem + lVar10;
        *(double *)pcVar4->_M_value = dVar14 + *(double *)pcVar12->_M_value;
        *(double *)(pcVar4->_M_value + 8) = dVar16 + dVar6;
        if ((dec & ~ELUPivot) == ELU) {
          pcVar12 = (this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                    super_TPZVec<std::complex<double>_>.fStore + lVar8;
          lVar8 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar8]
          ;
          if (((lVar8 < 0) ||
              ((U->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar8)) ||
             ((U->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar4 = U->fElem;
          uVar15 = *(undefined8 *)(pcVar4[lVar8]._M_value + 8);
          uVar13 = __divdc3(*(undefined8 *)pcVar4[lVar8]._M_value,uVar15,
                            *(undefined8 *)pcVar12->_M_value,*(undefined8 *)(pcVar12->_M_value + 8))
          ;
          *(undefined8 *)pcVar4[lVar8]._M_value = uVar13;
          *(undefined8 *)(pcVar4[lVar8]._M_value + 8) = uVar15;
        }
        bVar5 = 3 < lVar7;
        lVar7 = lVar7 + -2;
      } while (bVar5);
    }
  }
  else if ((this->fSymmetric == EIsSymmetric) &&
          (lVar7 = (long)this->fNumEq, 0 < (long)this->fNumEq)) {
    do {
      piVar3 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
      iVar1 = piVar3[lVar7 + -1];
      lVar8 = (long)iVar1;
      iVar2 = piVar3[lVar7];
      dVar14 = 0.0;
      dVar16 = 0.0;
      if (iVar1 + 1 < iVar2) {
        lVar10 = lVar8;
        lVar11 = lVar8 << 4;
        do {
          lVar9 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                        [lVar10 + 1];
          if (((lVar9 < 0) ||
              ((U->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar9)) ||
             ((U->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_48 = *(double *)U->fElem[lVar9]._M_value;
          dStack_40 = *(double *)(U->fElem[lVar9]._M_value + 8);
          std::complex<double>::operator*=
                    ((complex<double> *)&local_48,
                     (complex<double> *)
                     ((this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                      super_TPZVec<std::complex<double>_>.fStore[1]._M_value + lVar11));
          dVar14 = dVar14 - local_48;
          dVar16 = dVar16 - dStack_40;
          lVar10 = lVar10 + 1;
          lVar11 = lVar11 + 0x10;
        } while (iVar2 + -1 != (int)lVar10);
      }
      lVar10 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar8];
      if (((lVar10 < 0) ||
          ((U->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar10)) ||
         ((U->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<double>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pcVar12 = U->fElem + lVar10;
      dVar6 = *(double *)(pcVar12->_M_value + 8);
      pcVar4 = U->fElem + lVar10;
      *(double *)pcVar4->_M_value = dVar14 + *(double *)pcVar12->_M_value;
      *(double *)(pcVar4->_M_value + 8) = dVar16 + dVar6;
      if (dec == ECholesky) {
        pcVar12 = (this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                  super_TPZVec<std::complex<double>_>.fStore + lVar8;
        lVar8 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar8];
        if (((lVar8 < 0) ||
            ((U->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar8)) ||
           ((U->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<std::complex<double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pcVar4 = U->fElem;
        uVar15 = *(undefined8 *)(pcVar4[lVar8]._M_value + 8);
        uVar13 = __divdc3(*(undefined8 *)pcVar4[lVar8]._M_value,uVar15,
                          *(undefined8 *)pcVar12->_M_value,*(undefined8 *)(pcVar12->_M_value + 8));
        *(undefined8 *)pcVar4[lVar8]._M_value = uVar13;
        *(undefined8 *)(pcVar4[lVar8]._M_value + 8) = uVar15;
      }
      bVar5 = 1 < lVar7;
      lVar7 = lVar7 + -1;
    } while (bVar5);
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnBackward(TPZFMatrix<TVar> & U, DecomposeType dec) {
	int n;
	if(IsSymmetric()==EIsSymmetric){
    	for(n=fNumEq-1; n>=0; n--) {
    		int index = fEqStart[n]; 
    		int last_term = fEqStart[n + 1];
    		TVar acum = 0.;
    		int i;
    		for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky){
               	U(fIndex[index],0) /= fEqValues[index];
    		}
    	}
	}else if(IsSymmetric()==EIsNonSymmetric){
        for(n=fNumEq-2; n>=0; n-=2) {
            int index = fEqStart[n];
            int last_term = fEqStart[n + 1];
            TVar acum = 0.;
            int i;
            for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky || dec == ELU){
                U(fIndex[index],0) /= fEqValues[index];
            }
        }
    }
}